

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O0

int av1_get_pred_context_uni_comp_ref_p(MACROBLOCKD *xd)

{
  uint uVar1;
  uint uVar2;
  int local_20;
  int pred_context;
  int brf_count;
  int frf_count;
  uint8_t *ref_counts;
  MACROBLOCKD *xd_local;
  
  uVar1 = (uint)xd->neighbors_ref_counts[1] + (uint)xd->neighbors_ref_counts[2] +
          (uint)xd->neighbors_ref_counts[3] + (uint)xd->neighbors_ref_counts[4];
  uVar2 = (uint)xd->neighbors_ref_counts[5] + (uint)xd->neighbors_ref_counts[6] +
          (uint)xd->neighbors_ref_counts[7];
  if (uVar1 == uVar2) {
    local_20 = 1;
  }
  else {
    local_20 = 2;
    if (uVar1 < uVar2) {
      local_20 = 0;
    }
  }
  return local_20;
}

Assistant:

int av1_get_pred_context_uni_comp_ref_p(const MACROBLOCKD *xd) {
  const uint8_t *const ref_counts = &xd->neighbors_ref_counts[0];

  // Count of forward references (L, L2, L3, or G)
  const int frf_count = ref_counts[LAST_FRAME] + ref_counts[LAST2_FRAME] +
                        ref_counts[LAST3_FRAME] + ref_counts[GOLDEN_FRAME];
  // Count of backward references (B or A)
  const int brf_count = ref_counts[BWDREF_FRAME] + ref_counts[ALTREF2_FRAME] +
                        ref_counts[ALTREF_FRAME];

  const int pred_context =
      (frf_count == brf_count) ? 1 : ((frf_count < brf_count) ? 0 : 2);

  assert(pred_context >= 0 && pred_context < UNI_COMP_REF_CONTEXTS);
  return pred_context;
}